

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroExplicitMessage_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::TestBody(NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroExplicitMessage_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  bool bVar1;
  Map<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage> *pMVar2;
  ExplicitForeignMessage *pEVar3;
  char *pcVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  key_arg<int> *pkVar5;
  char *in_R9;
  string local_3b0;
  AssertHelper local_390;
  Message local_388;
  key_arg<int> local_380;
  bool local_379;
  undefined1 local_378 [8];
  AssertionResult gtest_ar__3;
  Message local_360;
  key_arg<int> local_354;
  int local_350 [2];
  undefined1 local_348 [8];
  AssertionResult gtest_ar_1;
  Message local_330;
  key_arg<int> local_328;
  int local_324;
  key_arg<int> local_320;
  int local_31c;
  undefined1 local_318 [8];
  AssertionResult gtest_ar;
  AssertHelper local_2e8;
  Message local_2e0;
  string local_2d8;
  string_view local_2b8;
  bool local_2a1;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar__2;
  TestAllMapTypes rt_msg;
  AssertHelper local_198;
  Message local_190;
  string local_188;
  bool local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__1;
  string local_148;
  AssertHelper local_128;
  Message local_120;
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_;
  TypeParam *output_sink;
  undefined1 local_e8 [8];
  TestAllMapTypes msg;
  NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroExplicitMessage_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  msg.field_0._192_8_ = this;
  proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes((TestAllMapTypes *)local_e8);
  pMVar2 = proto2_nofieldpresence_unittest::TestAllMapTypes::
           mutable_map_int32_explicit_foreign_message((TestAllMapTypes *)local_e8);
  output_sink._0_4_ = 0;
  pEVar3 = Map<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>::operator[]<int>
                     (pMVar2,(key_arg<int> *)&output_sink);
  proto2_nofieldpresence_unittest::ExplicitForeignMessage::set_c(pEVar3,0);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )NoFieldPresenceMapSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::GetOutputSinkRef(&this->
                             super_NoFieldPresenceMapSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           );
  local_111 = protobuf::(anonymous_namespace)::TestSerialize<std::__cxx11::string>
                        ((MessageLite *)local_e8,
                         (string *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_110,&local_111,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_148,(internal *)local_110,
               (AssertionResult *)"TestSerialize(msg, &output_sink)","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x3db,pcVar4);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    testing::Message::~Message(&local_120);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    NoFieldPresenceMapSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::GetOutput(&local_188,
                &this->
                 super_NoFieldPresenceMapSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               );
    local_161 = (bool)std::__cxx11::string::empty();
    local_161 = (bool)(local_161 ^ 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_160,&local_161,(type *)0x0);
    std::__cxx11::string::~string((string *)&local_188);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
    if (!bVar1) {
      testing::Message::Message(&local_190);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&rt_msg.field_0._impl_._cached_size_,(internal *)local_160,
                 (AssertionResult *)"this->GetOutput().empty()","true","false",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_198,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                 ,0x3dd,pcVar4);
      testing::internal::AssertHelper::operator=(&local_198,&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_198);
      std::__cxx11::string::~string((string *)&rt_msg.field_0._impl_._cached_size_);
      testing::Message::~Message(&local_190);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes
                ((TestAllMapTypes *)&gtest_ar__2.message_);
      NoFieldPresenceMapSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::GetOutput(&local_2d8,
                  &this->
                   super_NoFieldPresenceMapSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 );
      local_2b8 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2d8);
      local_2a1 = protobuf::MessageLite::ParseFromString
                            ((MessageLite *)&gtest_ar__2.message_,local_2b8);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_2a0,&local_2a1,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_2d8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
      if (!bVar1) {
        testing::Message::Message(&local_2e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar.message_,(internal *)local_2a0,
                   (AssertionResult *)"rt_msg.ParseFromString(this->GetOutput())","false","true",
                   in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_2e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                   ,0x3e1,pcVar4);
        testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
        testing::internal::AssertHelper::~AssertHelper(&local_2e8);
        std::__cxx11::string::~string((string *)&gtest_ar.message_);
        testing::Message::~Message(&local_2e0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
      pMVar2 = proto2_nofieldpresence_unittest::TestAllMapTypes::map_int32_explicit_foreign_message
                         ((TestAllMapTypes *)&gtest_ar__2.message_);
      local_320 = 0;
      pkVar5 = &local_320;
      pEVar3 = Map<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>::at<int>
                         (pMVar2,pkVar5);
      local_31c = proto2_nofieldpresence_unittest::ExplicitForeignMessage::c
                            (pEVar3,pkVar5,extraout_RDX);
      pMVar2 = proto2_nofieldpresence_unittest::TestAllMapTypes::map_int32_explicit_foreign_message
                         ((TestAllMapTypes *)local_e8);
      local_328 = 0;
      pkVar5 = &local_328;
      pEVar3 = Map<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>::at<int>
                         (pMVar2,pkVar5);
      local_324 = proto2_nofieldpresence_unittest::ExplicitForeignMessage::c
                            (pEVar3,pkVar5,extraout_RDX_00);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_318,"rt_msg.map_int32_explicit_foreign_message().at(0).c()",
                 "msg.map_int32_explicit_foreign_message().at(0).c()",&local_31c,&local_324);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
      if (!bVar1) {
        testing::Message::Message(&local_330);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                   ,0x3e4,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_330);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_330);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
      local_350[1] = 0;
      pMVar2 = proto2_nofieldpresence_unittest::TestAllMapTypes::map_int32_explicit_foreign_message
                         ((TestAllMapTypes *)&gtest_ar__2.message_);
      local_354 = 0;
      pkVar5 = &local_354;
      pEVar3 = Map<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>::at<int>
                         (pMVar2,pkVar5);
      local_350[0] = proto2_nofieldpresence_unittest::ExplicitForeignMessage::c
                               (pEVar3,pkVar5,extraout_RDX_01);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_348,"0","rt_msg.map_int32_explicit_foreign_message().at(0).c()",
                 local_350 + 1,local_350);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
      if (!bVar1) {
        testing::Message::Message(&local_360);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                   ,1000,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_360)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_360);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
      pMVar2 = proto2_nofieldpresence_unittest::TestAllMapTypes::map_int32_explicit_foreign_message
                         ((TestAllMapTypes *)&gtest_ar__2.message_);
      local_380 = 0;
      pEVar3 = Map<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>::at<int>
                         (pMVar2,&local_380);
      local_379 = proto2_nofieldpresence_unittest::ExplicitForeignMessage::has_c(pEVar3);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_378,&local_379,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
      if (!bVar1) {
        testing::Message::Message(&local_388);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_3b0,(internal *)local_378,
                   (AssertionResult *)"rt_msg.map_int32_explicit_foreign_message().at(0).has_c()",
                   "false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_390,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                   ,0x3ed,pcVar4);
        testing::internal::AssertHelper::operator=(&local_390,&local_388);
        testing::internal::AssertHelper::~AssertHelper(&local_390);
        std::__cxx11::string::~string((string *)&local_3b0);
        testing::Message::~Message(&local_388);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
      proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes
                ((TestAllMapTypes *)&gtest_ar__2.message_);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes((TestAllMapTypes *)local_e8);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceMapSerializeTest,
           MapRoundTripZeroKeyZeroExplicitMessage) {
  TestAllMapTypes msg;
  (*msg.mutable_map_int32_explicit_foreign_message())[0].set_c(0);

  // Test that message can serialize.
  TypeParam& output_sink = this->GetOutputSinkRef();
  ASSERT_TRUE(TestSerialize(msg, &output_sink));
  // Maps with zero key or value fields are still serialized.
  ASSERT_FALSE(this->GetOutput().empty());

  // Test that message can roundtrip.
  TestAllMapTypes rt_msg;
  EXPECT_TRUE(rt_msg.ParseFromString(this->GetOutput()));
  // TODO: b/368089585 - write this better when we have access to EqualsProto.
  EXPECT_EQ(rt_msg.map_int32_explicit_foreign_message().at(0).c(),
            msg.map_int32_explicit_foreign_message().at(0).c());

  // The map behaviour is pretty much the same whether the key/value field is
  // zero or not.
  EXPECT_EQ(0, rt_msg.map_int32_explicit_foreign_message().at(0).c());

  // However, explicit presence messages expose a `has_foo` API.
  // Because fields in an explicit message is explicitly set, they are expected
  // to be present.
  EXPECT_TRUE(rt_msg.map_int32_explicit_foreign_message().at(0).has_c());
}